

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BronKerbosch.cpp
# Opt level: O0

bool __thiscall
BronKerbosch::cliquesistent
          (BronKerbosch *this,alignment_set_t *R,alignment_set_t *P,alignment_set_t *X)

{
  bool bVar1;
  undefined1 uVar2;
  byte bVar3;
  size_type __n;
  ostream *poVar4;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  BronKerbosch *pos;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *set;
  ostream *poVar5;
  long in_RDI;
  size_type i_3;
  size_type i_2;
  size_type i_1;
  alignment_set_t tmp;
  alignment_set_t intersect;
  size_type i;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffde8;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffdf0;
  size_type in_stack_fffffffffffffdf8;
  alignment_set_t *in_stack_fffffffffffffe00;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffe08;
  BronKerbosch *in_stack_fffffffffffffe10;
  size_type in_stack_fffffffffffffe20;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffe28;
  undefined6 in_stack_fffffffffffffe30;
  undefined1 in_stack_fffffffffffffe36;
  undefined1 in_stack_fffffffffffffe37;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffe38;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *local_160;
  BronKerbosch *local_138;
  ulong local_a8;
  size_type local_30;
  bool local_1;
  
  __n = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::find_first
                  ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x257054);
  std::
  vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::operator[](*(vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 **)(in_RDI + 0x60),__n);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::set
            (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
             SUB81((ulong)in_stack_fffffffffffffdf0 >> 0x38,0));
  local_30 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::find_next
                       (in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
  while (local_30 != 0xffffffffffffffff) {
    std::
    vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::operator[](*(vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   **)(in_RDI + 0x60),local_30);
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
              (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::set
              (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
               SUB81((ulong)in_stack_fffffffffffffdf0 >> 0x38,0));
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator&=
              ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
               in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
              ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x257155);
    local_30 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::find_next
                         (in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
  }
  bVar1 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::is_subset_of
                    (in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
  if (bVar1) {
    boost::operator|(in_stack_fffffffffffffe38,
                     (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                     CONCAT17(in_stack_fffffffffffffe37,
                              CONCAT16(in_stack_fffffffffffffe36,in_stack_fffffffffffffe30)));
    uVar2 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::is_subset_of
                      (in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
    bVar3 = uVar2 ^ 0xff;
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
              ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x25740e);
    if ((bVar3 & 1) == 0) {
      local_1 = true;
    }
    else {
      std::operator<<((ostream *)&std::cerr,"(P | X) - intersect:");
      boost::operator|(in_stack_fffffffffffffe38,
                       (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                       CONCAT17(uVar2,CONCAT16(bVar3,in_stack_fffffffffffffe30)));
      boost::operator-(in_stack_fffffffffffffe38,
                       (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                       CONCAT17(uVar2,CONCAT16(bVar3,in_stack_fffffffffffffe30)));
      printSet(in_stack_fffffffffffffe10,(ostream *)in_stack_fffffffffffffe08,
               in_stack_fffffffffffffe00);
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
                ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x257499);
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
                ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x2574a6);
      this_00 = (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                std::operator<<((ostream *)&std::cerr,"vertices in P:");
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      pos = (BronKerbosch *)
            boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::find_first
                      ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x2574e0);
      local_138 = pos;
      while (local_138 != (BronKerbosch *)0xffffffffffffffff) {
        poVar4 = (ostream *)std::ostream::operator<<(&std::cerr,(ulong)local_138);
        std::operator<<(poVar4,":");
        std::
        vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        ::operator[](*(vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       **)(in_RDI + 0x60),(size_type)local_138);
        boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
                  (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
        printSet(in_stack_fffffffffffffe10,(ostream *)in_stack_fffffffffffffe08,
                 in_stack_fffffffffffffe00);
        boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
                  ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x257587);
        in_stack_fffffffffffffe10 =
             (BronKerbosch *)
             boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::find_next
                       (this_00,(size_type)pos);
        local_138 = in_stack_fffffffffffffe10;
      }
      poVar4 = std::operator<<((ostream *)&std::cerr,"vertices in X:");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      set = (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
            boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::find_first
                      ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x257684);
      local_160 = set;
      while (local_160 !=
             (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0xffffffffffffffff) {
        poVar5 = (ostream *)std::ostream::operator<<(&std::cerr,(ulong)local_160);
        std::operator<<(poVar5,":");
        std::
        vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        ::operator[](*(vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       **)(in_RDI + 0x60),(size_type)local_160);
        boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
                  (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
        printSet(in_stack_fffffffffffffe10,poVar4,set);
        boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
                  ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x25772b);
        in_stack_fffffffffffffdf0 =
             (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
             boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::find_next
                       (this_00,(size_type)pos);
        local_160 = in_stack_fffffffffffffdf0;
      }
      local_1 = false;
    }
  }
  else {
    std::operator<<((ostream *)&std::cerr,"R - intersect:");
    boost::operator-(in_stack_fffffffffffffe38,
                     (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                     CONCAT17(in_stack_fffffffffffffe37,
                              CONCAT16(in_stack_fffffffffffffe36,in_stack_fffffffffffffe30)));
    printSet(in_stack_fffffffffffffe10,(ostream *)in_stack_fffffffffffffe08,
             in_stack_fffffffffffffe00);
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
              ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x25724a);
    poVar4 = std::operator<<((ostream *)&std::cerr,"vertices in R:");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    local_a8 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::find_first
                         ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x257284)
    ;
    while (local_a8 != 0xffffffffffffffff) {
      poVar4 = (ostream *)std::ostream::operator<<(&std::cerr,local_a8);
      std::operator<<(poVar4,":");
      std::
      vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::operator[](*(vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                     **)(in_RDI + 0x60),local_a8);
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
                (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
      printSet(in_stack_fffffffffffffe10,(ostream *)in_stack_fffffffffffffe08,
               in_stack_fffffffffffffe00);
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
                ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x25732b);
      local_a8 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::find_next
                           (in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
    }
    local_1 = false;
  }
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
            ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x2577b1);
  return local_1;
}

Assistant:

bool BronKerbosch::cliquesistent(const alignment_set_t& R, const alignment_set_t& P, const alignment_set_t& X) {
    auto i = R.find_first();
    alignment_set_t intersect((*vertices_)[i]);
    intersect.set(i);

    for (i=R.find_next(i); i != alignment_set_t::npos; i = R.find_next(i)) {
        alignment_set_t tmp((*vertices_)[i]);
        tmp.set(i);

        intersect &= tmp;
    }
    if (not R.is_subset_of(intersect)) {
        cerr << "R - intersect:";
        printSet(cerr, R - intersect);
        cerr << "vertices in R:" << endl;
        for (auto i=R.find_first(); i != alignment_set_t::npos; i = R.find_next(i)) {
            cerr << i << ":";
            printSet(cerr, (*vertices_)[i]);
        }
        return false;
    }
    if (not (P | X).is_subset_of(intersect)) {
        cerr << "(P | X) - intersect:";
        printSet(cerr, (P | X) - intersect);
        cerr << "vertices in P:" << endl;
        for (auto i=P.find_first(); i != alignment_set_t::npos; i = P.find_next(i)) {
            cerr << i << ":";
            printSet(cerr, (*vertices_)[i]);
        }
        cerr << "vertices in X:" << endl;
        for (auto i=X.find_first(); i != alignment_set_t::npos; i = X.find_next(i)) {
            cerr << i << ":";
            printSet(cerr, (*vertices_)[i]);
        }

        return false;
    }
    return true;
}